

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

void av1_set_variance_partition_thresholds(AV1_COMP *cpi,int qindex,int content_lowsumdiff)

{
  if ((cpi->sf).part_sf.partition_search_type == '\x02') {
    set_vbp_thresholds(cpi,(cpi->vbp_info).thresholds,0,qindex,content_lowsumdiff,0,0,false,0);
    (cpi->vbp_info).threshold_minmax = (long)((qindex >> 3) + 0xf);
  }
  return;
}

Assistant:

void av1_set_variance_partition_thresholds(AV1_COMP *cpi, int qindex,
                                           int content_lowsumdiff) {
  SPEED_FEATURES *const sf = &cpi->sf;
  if (sf->part_sf.partition_search_type != VAR_BASED_PARTITION) {
    return;
  } else {
    set_vbp_thresholds(cpi, cpi->vbp_info.thresholds, 0, qindex,
                       content_lowsumdiff, 0, 0, 0, 0);
    // The threshold below is not changed locally.
    cpi->vbp_info.threshold_minmax = 15 + (qindex >> 3);
  }
}